

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

SRes SzGetNextFolderItem(CSzFolder *f,CSzData *sd)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  SRes SVar4;
  long *in_RSI;
  uint *in_RDI;
  int __result___6;
  UInt32 index;
  int __result___5;
  int __result___4;
  CSzBond *bp;
  Byte coderUsed [4];
  UInt32 numPackStreams;
  UInt32 numBonds;
  Byte streamUsed [7];
  int __result___3;
  UInt32 propsSize;
  int __result___2;
  int __result___1;
  UInt32 numStreams;
  UInt64 id;
  uint j;
  uint idSize;
  CSzCoderInfo *coder;
  Byte mainByte;
  int __result__;
  Byte *dataStart;
  UInt32 numInStreams;
  UInt32 i;
  UInt32 numCoders;
  uint local_8c;
  UInt32 *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  char acStack_6b [7];
  SRes local_64;
  uint local_60;
  SRes local_5c;
  SRes local_58;
  uint local_54;
  ulong local_50;
  uint local_48;
  uint local_44;
  uint *local_40;
  byte local_35;
  SRes local_34;
  long local_30;
  uint local_24;
  uint local_20;
  uint local_1c;
  long *local_18;
  uint *local_10;
  SRes local_4;
  
  local_24 = 0;
  local_30 = *in_RSI;
  *in_RDI = 0;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_4 = SzReadNumber32((CSzData *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                           in_stack_ffffffffffffff80);
  local_34 = local_4;
  if (local_4 == 0) {
    if ((local_1c == 0) || (4 < local_1c)) {
      local_4 = 4;
    }
    else {
      for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
        local_40 = local_10 + (ulong)local_20 * 4 + 0xe;
        if (local_18[1] == 0) {
          return 0x10;
        }
        local_18[1] = local_18[1] + -1;
        pbVar1 = (byte *)*local_18;
        *local_18 = (long)(pbVar1 + 1);
        local_35 = *pbVar1;
        if ((local_35 & 0xc0) != 0) {
          return 4;
        }
        local_44 = local_35 & 0xf;
        if (8 < local_44) {
          return 4;
        }
        if ((ulong)local_18[1] < (ulong)local_44) {
          return 0x10;
        }
        local_50 = 0;
        for (local_48 = 0; local_48 < local_44; local_48 = local_48 + 1) {
          local_50 = local_50 << 8 | (ulong)*(byte *)*local_18;
          *local_18 = *local_18 + 1;
          local_18[1] = local_18[1] + -1;
        }
        if (0xffffffff < local_50) {
          return 4;
        }
        local_40[2] = (uint)local_50;
        *(undefined1 *)(local_40 + 3) = 1;
        local_40[0] = 0;
        local_40[1] = 0;
        *(undefined1 *)((long)local_40 + 0xd) = 0;
        if ((local_35 & 0x10) != 0) {
          local_58 = SzReadNumber32((CSzData *)
                                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                    in_stack_ffffffffffffff80);
          if (local_58 != 0) {
            return local_58;
          }
          if (7 < local_54) {
            return 4;
          }
          *(char *)(local_40 + 3) = (char)local_54;
          local_5c = SzReadNumber32((CSzData *)
                                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                    in_stack_ffffffffffffff80);
          if (local_5c != 0) {
            return local_5c;
          }
          if (local_54 != 1) {
            return 4;
          }
        }
        local_24 = (byte)local_40[3] + local_24;
        if (7 < local_24) {
          return 4;
        }
        if ((local_35 & 0x20) != 0) {
          local_60 = 0;
          local_64 = SzReadNumber32((CSzData *)
                                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                    in_stack_ffffffffffffff80);
          if (local_64 != 0) {
            return local_64;
          }
          if ((ulong)local_18[1] < (ulong)local_60) {
            return 0x10;
          }
          if (0x7f < local_60) {
            return 4;
          }
          *(long *)local_40 = *local_18 - local_30;
          *(char *)((long)local_40 + 0xd) = (char)local_60;
          *local_18 = (ulong)local_60 + *local_18;
          local_18[1] = local_18[1] - (ulong)local_60;
        }
      }
      uVar2 = local_1c - 1;
      if (local_24 < uVar2) {
        local_4 = 0x10;
      }
      else if (uVar2 < 4) {
        local_10[1] = uVar2;
        uVar3 = local_24 - uVar2;
        if (uVar3 < 5) {
          local_10[2] = uVar3;
          for (local_20 = 0; local_20 < local_24; local_20 = local_20 + 1) {
            acStack_6b[local_20] = '\0';
          }
          if (uVar2 != 0) {
            for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
              (&stack0xffffffffffffff88)[local_20] = 0;
            }
            for (local_20 = 0; local_20 < uVar2; local_20 = local_20 + 1) {
              in_stack_ffffffffffffff80 = local_10 + (ulong)local_20 * 2 + 8;
              SVar4 = SzReadNumber32((CSzData *)CONCAT44(uVar3,in_stack_ffffffffffffff88),
                                     in_stack_ffffffffffffff80);
              if (SVar4 != 0) {
                return SVar4;
              }
              if ((local_24 <= *in_stack_ffffffffffffff80) ||
                 (acStack_6b[*in_stack_ffffffffffffff80] != '\0')) {
                return 0x10;
              }
              acStack_6b[*in_stack_ffffffffffffff80] = '\x01';
              SVar4 = SzReadNumber32((CSzData *)CONCAT44(uVar3,in_stack_ffffffffffffff88),
                                     in_stack_ffffffffffffff80);
              if (SVar4 != 0) {
                return SVar4;
              }
              if ((local_1c <= in_stack_ffffffffffffff80[1]) ||
                 ((&stack0xffffffffffffff88)[in_stack_ffffffffffffff80[1]] != '\0')) {
                return 0x10;
              }
              (&stack0xffffffffffffff88)[in_stack_ffffffffffffff80[1]] = 1;
            }
            for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
              if ((&stack0xffffffffffffff88)[local_20] == '\0') {
                local_10[3] = local_20;
                break;
              }
            }
            if (local_20 == local_1c) {
              return 0x10;
            }
          }
          if (uVar3 == 1) {
            for (local_20 = 0; (local_20 < local_24 && (acStack_6b[local_20] != '\0'));
                local_20 = local_20 + 1) {
            }
            if (local_20 == local_24) {
              return 0x10;
            }
            local_10[4] = local_20;
          }
          else {
            for (local_20 = 0; local_20 < uVar3; local_20 = local_20 + 1) {
              SVar4 = SzReadNumber32((CSzData *)CONCAT44(uVar3,in_stack_ffffffffffffff88),
                                     in_stack_ffffffffffffff80);
              if (SVar4 != 0) {
                return SVar4;
              }
              if ((local_24 <= local_8c) || (acStack_6b[local_8c] != '\0')) {
                return 0x10;
              }
              acStack_6b[local_8c] = '\x01';
              local_10[(ulong)local_20 + 4] = local_8c;
            }
          }
          *local_10 = local_1c;
          local_4 = 0;
        }
        else {
          local_4 = 4;
        }
      }
      else {
        local_4 = 4;
      }
    }
  }
  return local_4;
}

Assistant:

SRes SzGetNextFolderItem(CSzFolder *f, CSzData *sd)
{
  UInt32 numCoders, i;
  UInt32 numInStreams = 0;
  const Byte *dataStart = sd->Data;

  f->NumCoders = 0;
  f->NumBonds = 0;
  f->NumPackStreams = 0;
  f->UnpackStream = 0;
  
  RINOK(SzReadNumber32(sd, &numCoders));
  if (numCoders == 0 || numCoders > SZ_NUM_CODERS_IN_FOLDER_MAX)
    return SZ_ERROR_UNSUPPORTED;
  
  for (i = 0; i < numCoders; i++)
  {
    Byte mainByte;
    CSzCoderInfo *coder = f->Coders + i;
    unsigned idSize, j;
    UInt64 id;
    
    SZ_READ_BYTE(mainByte);
    if ((mainByte & 0xC0) != 0)
      return SZ_ERROR_UNSUPPORTED;
    
    idSize = (unsigned)(mainByte & 0xF);
    if (idSize > sizeof(id))
      return SZ_ERROR_UNSUPPORTED;
    if (idSize > sd->Size)
      return SZ_ERROR_ARCHIVE;
    id = 0;
    for (j = 0; j < idSize; j++)
    {
      id = ((id << 8) | *sd->Data);
      sd->Data++;
      sd->Size--;
    }
    if (id > (UInt32)0xFFFFFFFF)
      return SZ_ERROR_UNSUPPORTED;
    coder->MethodID = (UInt32)id;
    
    coder->NumStreams = 1;
    coder->PropsOffset = 0;
    coder->PropsSize = 0;
    
    if ((mainByte & 0x10) != 0)
    {
      UInt32 numStreams;
      
      RINOK(SzReadNumber32(sd, &numStreams));
      if (numStreams > k_NumCodersStreams_in_Folder_MAX)
        return SZ_ERROR_UNSUPPORTED;
      coder->NumStreams = (Byte)numStreams;

      RINOK(SzReadNumber32(sd, &numStreams));
      if (numStreams != 1)
        return SZ_ERROR_UNSUPPORTED;
    }

    numInStreams += coder->NumStreams;

    if (numInStreams > k_NumCodersStreams_in_Folder_MAX)
      return SZ_ERROR_UNSUPPORTED;

    if ((mainByte & 0x20) != 0)
    {
      UInt32 propsSize = 0;
      RINOK(SzReadNumber32(sd, &propsSize));
      if (propsSize > sd->Size)
        return SZ_ERROR_ARCHIVE;
      if (propsSize >= 0x80)
        return SZ_ERROR_UNSUPPORTED;
      coder->PropsOffset = sd->Data - dataStart;
      coder->PropsSize = (Byte)propsSize;
      sd->Data += (size_t)propsSize;
      sd->Size -= (size_t)propsSize;
    }
  }

  /*
  if (numInStreams == 1 && numCoders == 1)
  {
    f->NumPackStreams = 1;
    f->PackStreams[0] = 0;
  }
  else
  */
  {
    Byte streamUsed[k_NumCodersStreams_in_Folder_MAX];
    UInt32 numBonds, numPackStreams;
    
    numBonds = numCoders - 1;
    if (numInStreams < numBonds)
      return SZ_ERROR_ARCHIVE;
    if (numBonds > SZ_NUM_BONDS_IN_FOLDER_MAX)
      return SZ_ERROR_UNSUPPORTED;
    f->NumBonds = numBonds;
    
    numPackStreams = numInStreams - numBonds;
    if (numPackStreams > SZ_NUM_PACK_STREAMS_IN_FOLDER_MAX)
      return SZ_ERROR_UNSUPPORTED;
    f->NumPackStreams = numPackStreams;
  
    for (i = 0; i < numInStreams; i++)
      streamUsed[i] = False;
    
    if (numBonds != 0)
    {
      Byte coderUsed[SZ_NUM_CODERS_IN_FOLDER_MAX];

      for (i = 0; i < numCoders; i++)
        coderUsed[i] = False;
      
      for (i = 0; i < numBonds; i++)
      {
        CSzBond *bp = f->Bonds + i;
        
        RINOK(SzReadNumber32(sd, &bp->InIndex));
        if (bp->InIndex >= numInStreams || streamUsed[bp->InIndex])
          return SZ_ERROR_ARCHIVE;
        streamUsed[bp->InIndex] = True;
        
        RINOK(SzReadNumber32(sd, &bp->OutIndex));
        if (bp->OutIndex >= numCoders || coderUsed[bp->OutIndex])
          return SZ_ERROR_ARCHIVE;
        coderUsed[bp->OutIndex] = True;
      }
      
      for (i = 0; i < numCoders; i++)
        if (!coderUsed[i])
        {
          f->UnpackStream = i;
          break;
        }
      
      if (i == numCoders)
        return SZ_ERROR_ARCHIVE;
    }
    
    if (numPackStreams == 1)
    {
      for (i = 0; i < numInStreams; i++)
        if (!streamUsed[i])
          break;
      if (i == numInStreams)
        return SZ_ERROR_ARCHIVE;
      f->PackStreams[0] = i;
    }
    else
      for (i = 0; i < numPackStreams; i++)
      {
        UInt32 index;
        RINOK(SzReadNumber32(sd, &index));
        if (index >= numInStreams || streamUsed[index])
          return SZ_ERROR_ARCHIVE;
        streamUsed[index] = True;
        f->PackStreams[i] = index;
      }
  }

  f->NumCoders = numCoders;

  return SZ_OK;
}